

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall
Catch::XmlWriter::startElement(XmlWriter *this,string *name,XmlFormatting fmt)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ensureTagClosed(this);
  newlineIfNecessary(this);
  if ((fmt & Indent) != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
    std::__cxx11::string::append((char *)&this->m_indent);
  }
  uStack_28 = CONCAT17(0x3c,(undefined7)uStack_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_os,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->m_tags,(value_type *)name);
  this->m_tagIsOpen = true;
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name, XmlFormatting fmt ) {
        ensureTagClosed();
        newlineIfNecessary();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
            m_indent += "  ";
        }
        m_os << '<' << name;
        m_tags.push_back( name );
        m_tagIsOpen = true;
        applyFormatting(fmt);
        return *this;
    }